

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexer.cpp
# Opt level: O1

void build_terminal_node_mappings<ExtIsoForest>(TreesIndexer *indexer,ExtIsoForest *model)

{
  pointer pSVar1;
  pointer puVar2;
  iterator __begin2;
  pointer pSVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::resize
            (&indexer->indices,
             ((long)(model->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(model->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  if ((indexer->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage !=
      (indexer->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>,_true>::
    _S_do_it(&indexer->indices);
  }
  pSVar3 = (indexer->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (indexer->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((pSVar3 != pSVar1) &&
     ((pSVar3->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pSVar3->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    do {
      puVar2 = (pSVar3->reference_points).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pSVar3->reference_points).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar2) {
        (pSVar3->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar2;
      }
      puVar2 = (pSVar3->reference_indptr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pSVar3->reference_indptr).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar2) {
        (pSVar3->reference_indptr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar2;
      }
      puVar2 = (pSVar3->reference_mapping).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pSVar3->reference_mapping).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar2) {
        (pSVar3->reference_mapping).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar2;
      }
      pSVar3 = pSVar3 + 1;
    } while (pSVar3 != pSVar1);
  }
  pSVar3 = (indexer->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((indexer->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
      _M_impl.super__Vector_impl_data._M_finish != pSVar3) {
    lVar6 = 0x90;
    lVar5 = 0;
    uVar4 = 0;
    do {
      build_terminal_node_mappings_single_tree<IsoHPlane>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)pSVar3 + lVar6 + -0x90),
                 (size_t *)
                 ((long)&(pSVar3->terminal_node_mappings).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar6),
                 (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                 ((long)&(((model->hplanes).
                           super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl + lVar5)
                );
      uVar4 = uVar4 + 1;
      pSVar3 = (indexer->indices).
               super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x98;
      lVar5 = lVar5 + 0x18;
    } while (uVar4 < (ulong)(((long)(indexer->indices).
                                    super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 3)
                            * -0x79435e50d79435e5));
  }
  return;
}

Assistant:

void build_terminal_node_mappings(TreesIndexer &indexer, const Model &model)
{
    indexer.indices.resize(get_ntrees(model));
    indexer.indices.shrink_to_fit();

    if (!indexer.indices.empty() && !indexer.indices.front().reference_points.empty())
    {
        for (auto &ind : indexer.indices)
        {
            ind.reference_points.clear();
            ind.reference_indptr.clear();
            ind.reference_mapping.clear();
        }
    }

    for (size_t tree = 0; tree < indexer.indices.size(); tree++)
    {
        build_terminal_node_mappings_single_tree(indexer.indices[tree].terminal_node_mappings,
                                                 indexer.indices[tree].n_terminal,
                                                 get_tree(model, tree));
    }
}